

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::InvocationInterlockPlacementPass::recordBeginOrEndInFunction
          (InvocationInterlockPlacementPass *this,Function *func)

{
  Function *this_00;
  size_type sVar1;
  mapped_type *pmVar2;
  byte bVar3;
  byte bVar4;
  byte local_59;
  undefined1 auStack_58 [7];
  ExtractionResult result;
  function<void_(spvtools::opt::Instruction_*)> local_40;
  byte local_1a;
  byte local_19;
  bool had_end;
  Function *pFStack_18;
  bool had_begin;
  Function *func_local;
  InvocationInterlockPlacementPass *this_local;
  
  pFStack_18 = func;
  func_local = (Function *)this;
  sVar1 = std::
          unordered_map<spvtools::opt::Function_*,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>_>_>
          ::count(&this->extracted_functions_,&stack0xffffffffffffffe8);
  this_00 = pFStack_18;
  if (sVar1 == 0) {
    local_19 = 0;
    local_1a = 0;
    _auStack_58 = this;
    std::function<void(spvtools::opt::Instruction*)>::
    function<spvtools::opt::InvocationInterlockPlacementPass::recordBeginOrEndInFunction(spvtools::opt::Function*)::__0,void>
              ((function<void(spvtools::opt::Instruction*)> *)&local_40,
               (anon_class_24_3_368acee5 *)auStack_58);
    Function::ForEachInst(this_00,&local_40,false,false);
    std::function<void_(spvtools::opt::Instruction_*)>::~function(&local_40);
    bVar3 = local_19 & 1;
    bVar4 = local_1a & 1;
    pmVar2 = std::
             unordered_map<spvtools::opt::Function_*,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult,_std::hash<spvtools::opt::Function_*>,_std::equal_to<spvtools::opt::Function_*>,_std::allocator<std::pair<spvtools::opt::Function_*const,_spvtools::opt::InvocationInterlockPlacementPass::ExtractionResult>_>_>
             ::operator[](&this->extracted_functions_,&stack0xffffffffffffffe8);
    *pmVar2 = (mapped_type)(local_59 & 0xf8 | bVar3 | bVar4 << 1);
  }
  return;
}

Assistant:

void InvocationInterlockPlacementPass::recordBeginOrEndInFunction(
    Function* func) {
  if (extracted_functions_.count(func)) {
    return;
  }

  bool had_begin = false;
  bool had_end = false;

  func->ForEachInst([this, &had_begin, &had_end](Instruction* inst) {
    switch (inst->opcode()) {
      case spv::Op::OpBeginInvocationInterlockEXT:
        had_begin = true;
        break;
      case spv::Op::OpEndInvocationInterlockEXT:
        had_end = true;
        break;
      case spv::Op::OpFunctionCall: {
        uint32_t function_id =
            inst->GetSingleWordInOperand(kFunctionCallFunctionIdInIdx);
        Function* inner_func = context()->GetFunction(function_id);
        recordBeginOrEndInFunction(inner_func);
        ExtractionResult result = extracted_functions_[inner_func];
        had_begin = had_begin || result.had_begin;
        had_end = had_end || result.had_end;
        break;
      }
      default:
        break;
    }
  });

  ExtractionResult result = {had_begin, had_end};
  extracted_functions_[func] = result;
}